

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
* __thiscall
imrt::EvaluationFunction::get_sorted_beamlets
          (multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
           *__return_storage_ptr__,EvaluationFunction *this,Plan *p)

{
  _Rb_tree_header *p_Var1;
  Station *this_00;
  int iVar2;
  _List_node_base *p_Var3;
  Matrix *pMVar4;
  _Rb_tree_node_base *p_Var5;
  _List_node_base *p_Var6;
  long lVar7;
  long lVar8;
  int o;
  double local_68;
  pair<double,_std::pair<imrt::Station_*,_int>_> local_48;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (_List_node_base *)Plan::get_stations_abi_cxx11_(p);
  p_Var6 = p_Var3;
  while (p_Var6 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != p_Var3) {
    this_00 = (Station *)p_Var6[1]._M_next;
    for (lVar7 = 0; iVar2 = Station::getNbBeamlets(this_00), lVar7 < iVar2; lVar7 = lVar7 + 1) {
      p_Var5 = (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_68 = 0.0;
      for (; (_Rb_tree_header *)p_Var5 != &(this->voxels)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        iVar2 = *(int *)&p_Var5[1]._M_parent;
        lVar8 = (long)*(int *)((long)&p_Var5[1]._M_parent + 4);
        pMVar4 = Station::getDepositionMatrix(this_00,iVar2);
        local_68 = local_68 +
                   *(double *)
                    (*(long *)&(this->D).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar2].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + lVar8 * 8) * pMVar4->p[lVar8][lVar7];
      }
      if ((local_68 != 0.0) || (NAN(local_68))) {
        local_48.first = local_68;
        local_48.second.second = (int)lVar7;
        local_48.second.first = this_00;
        std::
        _Rb_tree<double,std::pair<double_const,std::pair<imrt::Station*,int>>,std::_Select1st<std::pair<double_const,std::pair<imrt::Station*,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
        ::_M_emplace_equal<std::pair<double,std::pair<imrt::Station*,int>>>
                  ((_Rb_tree<double,std::pair<double_const,std::pair<imrt::Station*,int>>,std::_Select1st<std::pair<double_const,std::pair<imrt::Station*,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
                    *)__return_storage_ptr__,&local_48);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

multimap < double, pair<Station*, int>, MagnitudeCompare >
EvaluationFunction::get_sorted_beamlets(Plan& p){
	//the sorted set of beamlets
	multimap < double, pair<Station*, int>, MagnitudeCompare > sorted_set;

	double max_ev=0.0;
	for(auto s:p.get_stations()){
		for(int b=0; b<s->getNbBeamlets(); b++){
			double ev=0; int i=0;
			for(auto voxel:voxels){
				int o=voxel.second.first;
				int k=voxel.second.second;
				const Matrix&  Dep = s->getDepositionMatrix(o);
				ev += D[o][k] * Dep(k,b);
			}
			if(ev==0) continue;
			sorted_set. insert(make_pair (ev,  make_pair(s,b)));
		}
	}

	return sorted_set;
}